

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_string.cpp
# Opt level: O0

void __thiscall string_conv_wchar_Test::TestBody(string_conv_wchar_Test *this)

{
  bool bVar1;
  size_t sVar2;
  char *pcVar3;
  wchar_t *pwVar4;
  AssertHelper local_280;
  Message local_278;
  int local_270 [2];
  undefined1 local_268 [8];
  AssertionResult gtest_ar_7;
  Message local_250;
  size_t local_248;
  size_t local_240;
  undefined1 local_238 [8];
  AssertionResult gtest_ar_6;
  wchar_buffer from_latin_1;
  Message local_1e0;
  int local_1d8 [2];
  undefined1 local_1d0 [8];
  AssertionResult gtest_ar_5;
  Message local_1b8;
  size_t local_1b0;
  size_t local_1a8;
  undefined1 local_1a0 [8];
  AssertionResult gtest_ar_4;
  wchar_buffer from_utf32;
  Message local_148;
  int local_140 [2];
  undefined1 local_138 [8];
  AssertionResult gtest_ar_3;
  Message local_120;
  size_t local_118;
  size_t local_110;
  undefined1 local_108 [8];
  AssertionResult gtest_ar_2;
  wchar_buffer from_utf16;
  Message local_b0;
  int local_a8 [2];
  undefined1 local_a0 [8];
  AssertionResult gtest_ar_1;
  Message local_88;
  size_t local_80 [3];
  size_t local_68;
  undefined1 local_60 [8];
  AssertionResult gtest_ar;
  wchar_buffer from_utf8;
  string_conv_wchar_Test *this_local;
  
  sVar2 = text_size<char,29ul>(&utf8_test_data);
  ST::utf8_to_wchar<wchar_t>((type *)&gtest_ar.message_,utf8_test_data,sVar2,check_validity);
  local_68 = text_size<wchar_t,11ul>
                       ((wchar_t (*) [11])L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff");
  local_80[0] = ST::buffer<wchar_t>::size((buffer<wchar_t> *)&gtest_ar.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_60,"text_size(wide_test_data)","from_utf8.size()",&local_68,local_80)
  ;
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_60);
  if (!bVar1) {
    testing::Message::Message(&local_88);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_60);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x18d,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,&local_88);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(&local_88);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_60);
  local_a8[1] = 0;
  pwVar4 = ST::buffer<wchar_t>::data((buffer<wchar_t> *)&gtest_ar.message_);
  local_a8[0] = T_strcmp<wchar_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",pwVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_a0,"0","T_strcmp(wide_test_data, from_utf8.data())",local_a8 + 1,
             local_a8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_a0);
  if (!bVar1) {
    testing::Message::Message(&local_b0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(from_utf16.m_data + 10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x18e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)(from_utf16.m_data + 10),&local_b0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(from_utf16.m_data + 10));
    testing::Message::~Message(&local_b0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_a0);
  sVar2 = text_size<char16_t,15ul>
                    ((char16_t (*) [15])L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff");
  ST::utf16_to_wchar<wchar_t>
            ((type *)&gtest_ar_2.message_,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",sVar2,
             check_validity);
  local_110 = text_size<wchar_t,11ul>
                        ((wchar_t (*) [11])L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff");
  local_118 = ST::buffer<wchar_t>::size((buffer<wchar_t> *)&gtest_ar_2.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_108,"text_size(wide_test_data)","from_utf16.size()",&local_110,
             &local_118);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_108);
  if (!bVar1) {
    testing::Message::Message(&local_120);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_108);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_3.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x193,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_3.message_,&local_120);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_3.message_);
    testing::Message::~Message(&local_120);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_108);
  local_140[1] = 0;
  pwVar4 = ST::buffer<wchar_t>::data((buffer<wchar_t> *)&gtest_ar_2.message_);
  local_140[0] = T_strcmp<wchar_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",pwVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_138,"0","T_strcmp(wide_test_data, from_utf16.data())",local_140 + 1,
             local_140);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_138);
  if (!bVar1) {
    testing::Message::Message(&local_148);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_138);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(from_utf32.m_data + 10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x194,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)(from_utf32.m_data + 10),&local_148);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(from_utf32.m_data + 10));
    testing::Message::~Message(&local_148);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_138);
  sVar2 = text_size<char32_t,11ul>
                    ((char32_t (*) [11])L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff");
  ST::utf32_to_wchar<wchar_t>
            ((type *)&gtest_ar_4.message_,L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",sVar2,
             check_validity);
  local_1a8 = text_size<wchar_t,11ul>
                        ((wchar_t (*) [11])L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff");
  local_1b0 = ST::buffer<wchar_t>::size((buffer<wchar_t> *)&gtest_ar_4.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_1a0,"text_size(wide_test_data)","from_utf32.size()",&local_1a8,
             &local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1a0);
  if (!bVar1) {
    testing::Message::Message(&local_1b8);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1a0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_5.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x199,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_5.message_,&local_1b8);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_5.message_);
    testing::Message::~Message(&local_1b8);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1a0);
  local_1d8[1] = 0;
  pwVar4 = ST::buffer<wchar_t>::data((buffer<wchar_t> *)&gtest_ar_4.message_);
  local_1d8[0] = T_strcmp<wchar_t>(L" \x7fÿĀ翿\xffff𐀀𐀠\x00040000\x0010ffff",pwVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_1d0,"0","T_strcmp(wide_test_data, from_utf32.data())",local_1d8 + 1,
             local_1d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_1d0);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_1d0);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)(from_latin_1.m_data + 10),kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19a,pcVar3);
    testing::internal::AssertHelper::operator=
              ((AssertHelper *)(from_latin_1.m_data + 10),&local_1e0);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)(from_latin_1.m_data + 10));
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_1d0);
  sVar2 = text_size<char,5ul>(&latin1_data);
  ST::latin_1_to_wchar<wchar_t>((type *)&gtest_ar_6.message_,latin1_data,sVar2);
  local_240 = text_size<wchar_t,5ul>((wchar_t (*) [5])L" ~\xa0ÿ");
  local_248 = ST::buffer<wchar_t>::size((buffer<wchar_t> *)&gtest_ar_6.message_);
  testing::internal::EqHelper::Compare<unsigned_long,_unsigned_long,_nullptr>
            ((EqHelper *)local_238,"text_size(latin1_wide)","from_latin_1.size()",&local_240,
             &local_248);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_238);
  if (!bVar1) {
    testing::Message::Message(&local_250);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_238);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_7.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19e,pcVar3);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_7.message_,&local_250);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_7.message_);
    testing::Message::~Message(&local_250);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_238);
  local_270[1] = 0;
  pwVar4 = ST::buffer<wchar_t>::data((buffer<wchar_t> *)&gtest_ar_6.message_);
  local_270[0] = T_strcmp<wchar_t>(L" ~\xa0ÿ",pwVar4);
  testing::internal::EqHelper::Compare<int,_int,_nullptr>
            ((EqHelper *)local_268,"0","T_strcmp(latin1_wide, from_latin_1.data())",local_270 + 1,
             local_270);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_268);
  if (!bVar1) {
    testing::Message::Message(&local_278);
    pcVar3 = testing::AssertionResult::failure_message((AssertionResult *)local_268);
    testing::internal::AssertHelper::AssertHelper
              (&local_280,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/zrax[P]string_theory/test/test_string.cpp"
               ,0x19f,pcVar3);
    testing::internal::AssertHelper::operator=(&local_280,&local_278);
    testing::internal::AssertHelper::~AssertHelper(&local_280);
    testing::Message::~Message(&local_278);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_268);
  ST::buffer<wchar_t>::~buffer((buffer<wchar_t> *)&gtest_ar_6.message_);
  ST::buffer<wchar_t>::~buffer((buffer<wchar_t> *)&gtest_ar_4.message_);
  ST::buffer<wchar_t>::~buffer((buffer<wchar_t> *)&gtest_ar_2.message_);
  ST::buffer<wchar_t>::~buffer((buffer<wchar_t> *)&gtest_ar.message_);
  return;
}

Assistant:

TEST(string, conv_wchar)
{
    // From UTF-8 to Wide
    ST::wchar_buffer from_utf8 = ST::utf8_to_wchar(utf8_test_data, text_size(utf8_test_data),
                                                   ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf8.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf8.data()));

    // From UTF-16 to Wide
    ST::wchar_buffer from_utf16 = ST::utf16_to_wchar(utf16_test_data, text_size(utf16_test_data),
                                                     ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf16.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf16.data()));

    // From UTF-32 to Wide
    ST::wchar_buffer from_utf32 = ST::utf32_to_wchar(test_data, text_size(test_data),
                                                     ST::check_validity);
    EXPECT_EQ(text_size(wide_test_data), from_utf32.size());
    EXPECT_EQ(0, T_strcmp(wide_test_data, from_utf32.data()));

    // From Latin-1 to Wide
    ST::wchar_buffer from_latin_1 = ST::latin_1_to_wchar(latin1_data, text_size(latin1_data));
    EXPECT_EQ(text_size(latin1_wide), from_latin_1.size());
    EXPECT_EQ(0, T_strcmp(latin1_wide, from_latin_1.data()));
}